

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_create_comp(char *filename,int *handle)

{
  int iVar1;
  FILE *pFVar2;
  int *in_RSI;
  char *in_RDI;
  int status;
  char mode [4];
  FILE *diskfile;
  char local_24 [4];
  int local_4;
  
  iVar1 = strcmp(in_RDI,"-.gz");
  pFVar2 = _stdout;
  if (((iVar1 != 0) && (iVar1 = strcmp(in_RDI,"stdout.gz"), pFVar2 = _stdout, iVar1 != 0)) &&
     (iVar1 = strcmp(in_RDI,"STDOUT.gz"), pFVar2 = _stdout, iVar1 != 0)) {
    strcpy(local_24,"w+b");
    pFVar2 = fopen64(in_RDI,"r");
    if (pFVar2 != (FILE *)0x0) {
      fclose(pFVar2);
      return 0x69;
    }
    pFVar2 = fopen64(in_RDI,local_24);
    if (pFVar2 == (FILE *)0x0) {
      return 0x69;
    }
  }
  local_4 = mem_createmem((size_t)in_RSI,&pFVar2->_flags);
  if (local_4 == 0) {
    memTable[*in_RSI].fileptr = (FILE *)pFVar2;
    local_4 = 0;
  }
  else {
    ffpmsg((char *)0x126dc0);
  }
  return local_4;
}

Assistant:

int mem_create_comp(char *filename, int *handle)
/*
  Create a new empty memory file for subsequent writes.
  Also create an empty compressed .gz file.  The memory file
  will be compressed and written to the disk file when the file is closed.
*/
{
    FILE *diskfile;
    char mode[4];
    int  status;

    /* first, create disk file for the compressed output */


    if ( !strcmp(filename, "-.gz") || !strcmp(filename, "stdout.gz") ||
         !strcmp(filename, "STDOUT.gz") )
    {
       /* special case: create uncompressed FITS file in memory, then
          compress it an write it out to 'stdout' when it is closed.  */

       diskfile = stdout;
    }
    else
    {
        /* normal case: create disk file for the compressed output */

        strcpy(mode, "w+b");    /* create file with read-write */

        diskfile = fopen(filename, "r"); /* does file already exist? */

        if (diskfile)
        {
            fclose(diskfile);         /* close file and exit with error */
            return(FILE_NOT_CREATED); 
        }

#if MACHINE == ALPHAVMS || MACHINE == VAXVMS
        /* specify VMS record structure: fixed format, 2880 byte records */
        /* but force stream mode access to enable random I/O access      */
        diskfile = fopen(filename, mode, "rfm=fix", "mrs=2880", "ctx=stm"); 
#else
        diskfile = fopen(filename, mode); 
#endif

        if (!(diskfile))           /* couldn't create file */
        {
            return(FILE_NOT_CREATED); 
        }
    }

    /* now create temporary memory file */

    /* initially allocate 1 FITS block = 2880 bytes */
    status = mem_createmem(2880L, handle);

    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_create_comp)");
        return(status);
    }

    memTable[*handle].fileptr = diskfile;

    return(0);
}